

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::
         FullClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,Options *options)

{
  FileOptions *pFVar1;
  string *psVar2;
  _anonymous_namespace_ *this;
  undefined8 *puVar3;
  Options *in_R8;
  string_view full_name;
  string classname;
  string php_namespace;
  string_view php_namespace_1;
  string local_e8;
  string local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_a8 [3];
  AlphaNum local_78;
  AlphaNum local_48;
  
  GeneratedClassName_abi_cxx11_(&local_e8,(php *)desc,(EnumDescriptor *)options);
  pFVar1 = desc->file_->options_;
  if ((*(byte *)((long)&pFVar1->field_0 + 0x18) & 0x80) == 0) {
    psVar2 = desc->file_->package_;
    this = (_anonymous_namespace_ *)psVar2->_M_string_length;
    if (this == (_anonymous_namespace_ *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,anon_var_dwarf_651463 + 5,(allocator<char> *)local_a8);
    }
    else {
      full_name._M_str = &options->is_descriptor;
      full_name._M_len = (size_t)(psVar2->_M_dataplus)._M_p;
      php::(anonymous_namespace)::PhpName_abi_cxx11_(&local_c8,this,full_name,in_R8);
    }
  }
  else {
    puVar3 = (undefined8 *)
             ((ulong)(pFVar1->field_0)._impl_.php_namespace_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    local_a8[0]._M_str = (char *)*puVar3;
    local_a8[0]._M_len = puVar3[1];
    if (local_a8[0]._M_len == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,anon_var_dwarf_651463 + 5,(allocator<char> *)&local_78);
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_c8,local_a8,(allocator<char> *)&local_78);
    }
  }
  if (local_c8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,local_e8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_e8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,local_e8.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_e8._M_string_length;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_a8[0]._M_len = local_c8._M_string_length;
    local_a8[0]._M_str = local_c8._M_dataplus._M_p;
    local_78.piece_ = absl::lts_20250127::NullSafeStringView("\\");
    local_48.piece_._M_len = local_e8._M_string_length;
    local_48.piece_._M_str = local_e8._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_a8,&local_78,&local_48,&local_78);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  return __return_storage_ptr__;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, const Options& options) {
  std::string classname = GeneratedClassName(desc);
  std::string php_namespace = RootPhpNamespace(desc, options);
  if (!php_namespace.empty()) {
    return absl::StrCat(php_namespace, "\\", classname);
  }
  return classname;
}